

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *f_00;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    f_00 = fopen(argv[1],"r");
    if (f_00 == (FILE *)0x0) {
      fprintf(_stderr,anon_var_dwarf_3387);
    }
    init_cos_cache();
    readStream((FILE *)f_00);
    argv_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,anon_var_dwarf_3371);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc != 2) {
        fprintf(stderr, "用法：jpeg_decoder <jpeg file>\n");
        return 1;
    }
    FILE *f = fopen(argv[1], "r");
    if (f == NULL) {
        fprintf(stderr, "檔案開啟失敗\n");
    }
    init_cos_cache();
    readStream(f);
    return 0;
}